

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall Generator::generateCode(Generator *this)

{
  bool bVar1;
  QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
  *pQVar2;
  SuperClass *pSVar3;
  QByteArrayView a;
  Data *pDVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  bool bVar8;
  QFlags<QtMocConstants::EnumFlags> *pQVar9;
  qsizetype qVar10;
  _Base_ptr p_Var11;
  ClassDef *pCVar12;
  QList<ClassDef::Interface> *pQVar13;
  QByteArray *pQVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  undefined8 *puVar18;
  QArrayDataPointer<char> *pQVar19;
  QByteArray *ba;
  PropertyDef *pPVar20;
  PropertyDef *pPVar21;
  QByteArray *rhs;
  FILE *pFVar22;
  EnumDef *pEVar23;
  char *pcVar24;
  _Rb_tree_node_base *p_Var25;
  QList<ClassDef::Interface> *pQVar26;
  ulong uVar27;
  long lVar28;
  PropertyDef *p;
  PropertyDef *pPVar29;
  ulong uVar30;
  QByteArray *pQVar31;
  long lVar32;
  long lVar33;
  long in_FS_OFFSET;
  QByteArrayView bv;
  QByteArrayView bv_00;
  QByteArrayView bv_01;
  size_t sStack_1a0;
  QStringBuilder<QStringBuilder<QByteArray_&,_const_char_(&)[3]>,_QByteArray_&> local_170;
  QArrayDataPointer<char> local_158;
  QArrayDataPointer<char> local_138;
  QMultiHash<QByteArray,_QByteArray> local_118;
  QArrayDataPointer<char> local_108;
  QArrayDataPointer<char> local_e8;
  EnumDef def;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  def.name.d.d = (Data *)0x1361ed;
  bVar5 = operator==((QByteArray *)this->cdef,(char **)&def);
  pCVar12 = this->cdef;
  lVar33 = (pCVar12->constructorList).d.size;
  local_58.super_QStringTokenizerBaseBase.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
  super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
  local_58.super_QStringTokenizerBaseBase.m_cs = CaseInsensitive;
  local_58.m_haystack.m_size = 0;
  local_58.m_haystack.m_data = (char *)0x0;
  pEVar23 = (pCVar12->super_BaseDef).enumList.d.ptr;
  for (lVar32 = (pCVar12->super_BaseDef).enumList.d.size * 0x68; lVar32 != 0;
      lVar32 = lVar32 + -0x68) {
    def.flags.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
    super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
         (QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>)0xaaaaaaaa;
    def._100_4_ = 0xaaaaaaaa;
    def.values.d.ptr = (QByteArray *)0xaaaaaaaaaaaaaaaa;
    def.values.d.size = -0x5555555555555556;
    def.type.d.size = -0x5555555555555556;
    def.values.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    def.type.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    def.type.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    def.enumName.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    def.enumName.d.size = -0x5555555555555556;
    def.name.d.size = -0x5555555555555556;
    def.enumName.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    def.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    def.name.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    EnumDef::EnumDef(&def,pEVar23);
    bVar6 = QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::contains
                      (&(this->cdef->super_BaseDef).enumDeclarations,&def.name);
    if (bVar6) {
      QList<EnumDef>::emplaceBack<EnumDef_const&>((QList<EnumDef> *)&local_58,&def);
    }
    QByteArray::operator=(&def.enumName,&def.name);
    local_e8.size = -0x5555555555555556;
    local_e8.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_e8.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    local_108.d = (Data *)0x0;
    local_108.ptr = (char *)0x0;
    local_108.size = 0;
    QMap<QByteArray,_QByteArray>::value
              ((QByteArray *)&local_e8,&(this->cdef->super_BaseDef).flagAliases,&def.name,
               (QByteArray *)&local_108);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_108);
    bVar6 = QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::contains
                      (&(this->cdef->super_BaseDef).enumDeclarations,(QByteArray *)&local_e8);
    if (bVar6) {
      QByteArray::operator=(&def.name,(QByteArray *)&local_e8);
      pQVar9 = QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::operator[]
                         (&(this->cdef->super_BaseDef).enumDeclarations,(QByteArray *)&local_e8);
      def.flags.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
      super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
           (QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>)
           (QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>)
           ((uint)def.flags.super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
                  super_QFlagsStorage<QtMocConstants::EnumFlags>.i |
           (pQVar9->super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>).
           super_QFlagsStorage<QtMocConstants::EnumFlags>.i);
      QList<EnumDef>::emplaceBack<EnumDef_const&>((QList<EnumDef> *)&local_58,&def);
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_e8);
    EnumDef::~EnumDef(&def);
    pEVar23 = pEVar23 + 1;
  }
  QArrayDataPointer<EnumDef>::operator=
            (&(this->cdef->super_BaseDef).enumList.d,(QArrayDataPointer<EnumDef> *)&local_58);
  QArrayDataPointer<EnumDef>::~QArrayDataPointer((QArrayDataPointer<EnumDef> *)&local_58);
  strreg(this,&(this->cdef->super_BaseDef).qualified);
  registerClassInfoStrings(this);
  registerFunctionStrings(this,&this->cdef->signalList);
  registerFunctionStrings(this,&this->cdef->slotList);
  registerFunctionStrings(this,&this->cdef->methodList);
  registerFunctionStrings(this,&this->cdef->constructorList);
  registerByteArrayVector(this,&this->cdef->nonClassSignalList);
  registerPropertyStrings(this);
  registerEnumStrings(this);
  pCVar12 = this->cdef;
  cVar7 = '\x01';
  if (this->requireCompleteTypes == false) {
    cVar7 = pCVar12->requireCompleteMethodTypes;
  }
  if (((pCVar12->hasQObject == false) && ((pCVar12->methodList).d.size == 0)) &&
     ((pCVar12->propertyList).d.size == 0)) {
    bVar6 = (pCVar12->constructorList).d.size == 0;
  }
  else {
    bVar6 = false;
  }
  bVar1 = (this->parser->super_Parser).activeQtMode;
  local_108.size = -0x5555555555555556;
  local_108.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_108.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_108,"ZN",-1);
  local_58.m_haystack.m_data = (pCVar12->super_BaseDef).qualified.d.ptr;
  local_58.m_haystack.m_size = (pCVar12->super_BaseDef).qualified.d.size;
  local_58.super_QStringTokenizerBaseBase.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
  super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x1;
  local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
  local_58.m_needle.ucs = L':';
  def.type.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  def.enumName.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  def.enumName.d.size = -0x5555555555555556;
  def.name.d.size = -0x5555555555555556;
  def.enumName.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  def.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  def.name.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator((iterator *)&def,&local_58);
  while ((char)def.enumName.d.d == '\x01') {
    a.m_data = (storage_type *)def.name.d.size;
    a.m_size = (qsizetype)def.name.d.ptr;
    QByteArray::number((longlong)&local_e8,(int)def.name.d.ptr);
    QByteArray::append((QByteArray *)&local_108);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_e8);
    QByteArray::append((QByteArray *)&local_108,a);
    QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)&def);
  }
  QByteArray::append((char)&local_108);
  if (this->cdef->hasQNamespace == false) {
    pcVar24 = QByteArray::data((QByteArray *)this->cdef);
  }
  else {
    pcVar24 = "void";
  }
  pcVar17 = local_108.ptr;
  if (local_108.ptr == (char *)0x0) {
    pcVar17 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,"namespace {\nstruct qt_meta_tag_%s_t {};\n} // unnamed namespace\n\n",
          pcVar17);
  pcVar17 = (this->cdef->super_BaseDef).qualified.d.ptr;
  if (pcVar17 == (char *)0x0) {
    pcVar17 = (char *)&QByteArray::_empty;
  }
  pcVar15 = local_108.ptr;
  if (local_108.ptr == (char *)0x0) {
    pcVar15 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,
          "template <> constexpr inline auto %s::qt_create_metaobjectdata<qt_meta_tag_%s_t>()\n{\n    namespace QMC = QtMocConstants;\n"
          ,pcVar17,pcVar15);
  fwrite("    QtMocHelpers::StringRefStorage qt_stringData {",0x32,1,(FILE *)this->out);
  addStrings(this,&this->strings);
  fwrite("\n    };\n\n",9,1,(FILE *)this->out);
  fwrite("    QtMocHelpers::UintData qt_methods {\n",0x28,1,(FILE *)this->out);
  addFunctions(this,&this->cdef->signalList,"Signal");
  addFunctions(this,&this->cdef->slotList,"Slot");
  addFunctions(this,&this->cdef->methodList,"Method");
  fwrite("    };\n    QtMocHelpers::UintData qt_properties {\n",0x32,1,(FILE *)this->out);
  addProperties(this);
  fwrite("    };\n    QtMocHelpers::UintData qt_enums {\n",0x2d,1,(FILE *)this->out);
  addEnums(this);
  fwrite("    };\n",7,1,(FILE *)this->out);
  if (lVar33 == 0) {
    pCVar12 = this->cdef;
    if ((pCVar12->super_BaseDef).classInfoList.d.size == 0) {
      pcVar17 = "";
      goto LAB_00107d7d;
    }
    fputs("    QtMocHelpers::UintData qt_constructors {};\n",(FILE *)this->out);
  }
  else {
    fwrite("    using Constructor = QtMocHelpers::NoType;\n    QtMocHelpers::UintData qt_constructors {\n"
           ,0x5b,1,(FILE *)this->out);
    addFunctions(this,&this->cdef->constructorList,"Constructor");
    fwrite("    };\n",7,1,(FILE *)this->out);
  }
  pCVar12 = this->cdef;
  if ((pCVar12->super_BaseDef).classInfoList.d.size == 0) {
    pcVar17 = ", qt_constructors";
  }
  else {
    fwrite("    QtMocHelpers::ClassInfos qt_classinfo({\n",0x2c,1,(FILE *)this->out);
    addClassInfos(this);
    fwrite("    });\n",8,1,(FILE *)this->out);
    pCVar12 = this->cdef;
    pcVar17 = ", qt_constructors, qt_classinfo";
  }
LAB_00107d7d:
  if ((pCVar12->hasQGadget == false) && (pCVar12->hasQNamespace != true)) {
    pcVar15 = "QMC::MetaObjectFlag{}";
  }
  else {
    pcVar15 = "QMC::PropertyAccessInStaticMetaCall";
  }
  def.name.d.d = (Data *)0x0;
  local_58.super_QStringTokenizerBaseBase.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
  super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
  local_58.super_QStringTokenizerBaseBase.m_cs = CaseInsensitive;
  local_58.m_haystack.m_size = 0;
  def.name.d.ptr = "void";
  local_58.m_haystack.m_data = (char *)0x0;
  def.name.d.size = 4;
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
  if (cVar7 == '\0') {
    local_e8.d = (Data *)0x133766;
    local_e8.size = 0x1335a3;
    local_e8.ptr = (char *)&local_108;
    QStringBuilder<QStringBuilder<const_char_(&)[13],_const_QByteArray_&>,_const_char_(&)[3]>::
    convertTo<QByteArray>
              ((QByteArray *)&local_58,
               (QStringBuilder<QStringBuilder<const_char_(&)[13],_const_QByteArray_&>,_const_char_(&)[3]>
                *)&local_e8);
    qVar10 = def.name.d.size;
    pcVar16 = def.name.d.ptr;
    pDVar4 = def.name.d.d;
    def.name.d.d = (Data *)local_58.super_QStringTokenizerBaseBase;
    def.name.d.ptr = (char *)local_58.m_haystack.m_size;
    local_58.super_QStringTokenizerBaseBase = (QStringTokenizerBaseBase)pDVar4;
    local_58.m_haystack.m_size = (qsizetype)pcVar16;
    def.name.d.size = (qsizetype)local_58.m_haystack.m_data;
    local_58.m_haystack.m_data = (char *)qVar10;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
  }
  pcVar16 = def.name.d.ptr;
  if (def.name.d.ptr == (char *)0x0) {
    pcVar16 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,
          "    return QtMocHelpers::metaObjectData<%s, %s>(%s, qt_stringData,\n            qt_methods, qt_properties, qt_enums%s);\n}\n"
          ,pcVar24,pcVar16,pcVar15,pcVar17);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&def);
  def.name.d.size = 0;
  def.name.d.d = (Data *)0x0;
  def.name.d.ptr = (char *)0x0;
  if (this->cdef->hasQNamespace == true) {
    local_e8.d = (Data *)CONCAT71(local_e8.d._1_7_,0x5f);
    local_e8.ptr = (char *)&local_108;
    QStringBuilder<char,_const_QByteArray_&>::convertTo<QByteArray>
              ((QByteArray *)&local_58,(QStringBuilder<char,_const_QByteArray_&> *)&local_e8);
    def.name.d.size = (qsizetype)local_58.m_haystack.m_data;
    pcVar24 = (char *)local_58.m_haystack.m_size;
    def.name.d.d = (Data *)local_58.super_QStringTokenizerBaseBase;
    local_58.super_QStringTokenizerBaseBase.m_sb.
    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.super_QFlagsStorage<Qt::SplitBehaviorFlags>
    .i = (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
    local_58.super_QStringTokenizerBaseBase.m_cs = CaseInsensitive;
    def.name.d.ptr = (char *)local_58.m_haystack.m_size;
    local_58.m_haystack.m_size = 0;
    local_58.m_haystack.m_data = (char *)0x0;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
    if (pcVar24 == (char *)0x0) {
      pcVar24 = (char *)&QByteArray::_empty;
    }
    pcVar17 = (this->cdef->super_BaseDef).qualified.d.ptr;
    if (pcVar17 == (char *)0x0) {
      pcVar17 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,
            "\nstatic constexpr auto qt_staticMetaObjectContent%s =\n    %s::qt_create_metaobjectdata<qt_meta_tag%s_t>();\nstatic constexpr auto qt_staticMetaObjectStaticContent%s =\n    qt_staticMetaObjectContent%s.staticData;\nstatic constexpr auto qt_staticMetaObjectRelocatingContent%s =\n    qt_staticMetaObjectContent%s.relocatingData;\n\n"
            ,pcVar24,pcVar17,pcVar24,pcVar24,pcVar24,pcVar24,pcVar24);
  }
  else {
    local_e8.d = (Data *)0x133765;
    local_e8.size = 0x133773;
    local_e8.ptr = (char *)&local_108;
    QStringBuilder<QStringBuilder<const_char_(&)[14],_const_QByteArray_&>,_const_char_(&)[4]>::
    convertTo<QByteArray>
              ((QByteArray *)&local_58,
               (QStringBuilder<QStringBuilder<const_char_(&)[14],_const_QByteArray_&>,_const_char_(&)[4]>
                *)&local_e8);
    def.name.d.ptr = (char *)local_58.m_haystack.m_size;
    def.name.d.d = (Data *)local_58.super_QStringTokenizerBaseBase;
    local_58.super_QStringTokenizerBaseBase.m_sb.
    super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.super_QFlagsStorage<Qt::SplitBehaviorFlags>
    .i = (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
    local_58.super_QStringTokenizerBaseBase.m_cs = CaseInsensitive;
    local_58.m_haystack.m_size = 0;
    def.name.d.size = (qsizetype)local_58.m_haystack.m_data;
    local_58.m_haystack.m_data = (char *)0x0;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
  }
  local_58.m_haystack.m_data = (char *)0x0;
  local_58.super_QStringTokenizerBaseBase.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
  super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
  local_58.super_QStringTokenizerBaseBase.m_cs = CaseInsensitive;
  local_58.m_haystack.m_size = 0;
  local_118.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_118.m_size = -0x5555555555555556;
  QMultiHash<QByteArray,_QByteArray>::QMultiHash(&local_118,&this->knownGadgets);
  QMultiHash<QByteArray,_QByteArray>::unite(&local_118,&this->knownQObjectClasses);
  pPVar29 = (this->cdef->propertyList).d.ptr;
  pPVar21 = pPVar29 + (this->cdef->propertyList).d.size;
  for (; pPVar29 != pPVar21; pPVar29 = pPVar29 + 1) {
    pQVar31 = &pPVar29->type;
    bVar8 = isBuiltinType(pQVar31);
    if (((!bVar8) && (bVar8 = QByteArray::contains(pQVar31,'*'), !bVar8)) &&
       ((bVar8 = QByteArray::contains(pQVar31,'<'), !bVar8 &&
        (bVar8 = QByteArray::contains(pQVar31,'>'), !bVar8)))) {
      qVar10 = QByteArrayView::lengthHelperCharArray("::",3);
      bv.m_data = "::";
      bv.m_size = qVar10;
      qVar10 = QByteArray::lastIndexOf(pQVar31,bv);
      if (0 < qVar10) {
        local_e8.size = -0x5555555555555556;
        local_e8.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_e8.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        QByteArray::left((QByteArray *)&local_e8,pQVar31,qVar10);
        pCVar12 = this->cdef;
        local_138.d = (pCVar12->super_BaseDef).qualified.d.d;
        local_138.ptr = (pCVar12->super_BaseDef).qualified.d.ptr;
        local_138.size = (pCVar12->super_BaseDef).qualified.d.size;
        if (local_138.d != (Data *)0x0) {
          LOCK();
          ((local_138.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_138.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        do {
          qVar10 = QByteArrayView::lengthHelperCharArray("::",3);
          bv_00.m_data = "::";
          bv_00.m_size = qVar10;
          qVar10 = QByteArray::lastIndexOf((QByteArray *)&local_138,bv_00);
          QByteArray::left((QByteArray *)&local_158,(QByteArray *)&local_138,qVar10);
          qVar10 = local_138.size;
          pcVar24 = local_138.ptr;
          pDVar4 = local_138.d;
          local_138.d = local_158.d;
          local_138.ptr = local_158.ptr;
          local_158.d = pDVar4;
          local_158.ptr = pcVar24;
          local_138.size = local_158.size;
          local_158.size = qVar10;
          QArrayDataPointer<char>::~QArrayDataPointer(&local_158);
          local_158.size = -0x5555555555555556;
          local_158.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_158.ptr = (char *)0xaaaaaaaaaaaaaaaa;
          if ((char *)local_138.size == (char *)0x0) {
            local_158.d = local_e8.d;
            local_158.ptr = local_e8.ptr;
            local_158.size = local_e8.size;
            if (local_e8.d != (Data *)0x0) {
              LOCK();
              ((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
          }
          else {
            local_170.a.b = (char (*) [3])0x133777;
            local_170.b = (QByteArray *)&local_e8;
            local_170.a.a = (QByteArray *)&local_138;
            QStringBuilder<QStringBuilder<QByteArray_&,_const_char_(&)[3]>,_QByteArray_&>::
            convertTo<QByteArray>((QByteArray *)&local_158,&local_170);
          }
          QMultiHash<QByteArray,_QByteArray>::constFindImpl<QByteArray>
                    ((const_iterator *)&local_170,&local_118,(QByteArray *)&local_158);
          pQVar31 = local_170.b;
          QArrayDataPointer<char>::~QArrayDataPointer(&local_158);
          if ((char *)local_138.size == (char *)0x0) {
            if (&pQVar31->d == (QArrayDataPointer<char> *)0x0) goto LAB_00108242;
            break;
          }
        } while (&pQVar31->d == (QArrayDataPointer<char> *)0x0);
        pQVar31 = *(QByteArray **)&pQVar31->d;
        local_158.d = (Data *)0x13377a;
        bVar8 = operator==(pQVar31,(char **)&local_158);
        if (((!bVar8) &&
            (bVar8 = qualifiedNameEquals(&(this->cdef->super_BaseDef).qualified,pQVar31), !bVar8))
           && (bVar8 = QListSpecialMethodsBase<QByteArray>::contains<QByteArray>
                                 ((QListSpecialMethodsBase<QByteArray> *)&local_58,pQVar31), !bVar8)
           ) {
          QList<QByteArray>::emplaceBack<QByteArray_const&>((QList<QByteArray> *)&local_58,pQVar31);
        }
LAB_00108242:
        QArrayDataPointer<char>::~QArrayDataPointer(&local_138);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_e8);
      }
    }
  }
  pQVar2 = (this->cdef->super_BaseDef).enumDeclarations.d.d.ptr;
  if (pQVar2 == (QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
                 *)0x0) {
    p_Var11 = (_Base_ptr)0x0;
  }
  else {
    p_Var11 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10)
    ;
  }
  p_Var25 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar2 == (QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
                 *)0x0) {
    p_Var25 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var11 != p_Var25; p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
    qVar10 = QByteArrayView::lengthHelperCharArray("::",3);
    bv_01.m_data = "::";
    bv_01.m_size = qVar10;
    qVar10 = QByteArray::lastIndexOf((QByteArray *)(p_Var11 + 1),bv_01);
    if (0 < qVar10) {
      local_e8.size = -0x5555555555555556;
      local_e8.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_e8.ptr = (char *)0xaaaaaaaaaaaaaaaa;
      QByteArray::left((QByteArray *)&local_e8,(QByteArray *)(p_Var11 + 1),qVar10);
      local_138.d = (Data *)0x13377a;
      bVar8 = operator!=((QByteArray *)&local_e8,(char **)&local_138);
      if (((bVar8) &&
          (bVar8 = qualifiedNameEquals(&(this->cdef->super_BaseDef).qualified,
                                       (QByteArray *)&local_e8), !bVar8)) &&
         (bVar8 = QListSpecialMethodsBase<QByteArray>::contains<QByteArray>
                            ((QListSpecialMethodsBase<QByteArray> *)&local_58,
                             (QByteArray *)&local_e8), !bVar8)) {
        QList<QByteArray>::emplaceBack<QByteArray_const&>
                  ((QList<QByteArray> *)&local_58,(QByteArray *)&local_e8);
      }
      QArrayDataPointer<char>::~QArrayDataPointer(&local_e8);
    }
  }
  if (local_58.m_haystack.m_data != (char *)0x0) {
    pcVar24 = local_108.ptr;
    if (local_108.ptr == (char *)0x0) {
      pcVar24 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,
            "Q_CONSTINIT static const QMetaObject::SuperData qt_meta_extradata_%s[] = {\n",pcVar24);
    qVar10 = local_58.m_haystack.m_size;
    for (lVar33 = (long)local_58.m_haystack.m_data * 0x18; lVar33 != 0; lVar33 = lVar33 + -0x18) {
      puVar18 = *(undefined8 **)(qVar10 + 8);
      if (puVar18 == (undefined8 *)0x0) {
        puVar18 = &QByteArray::_empty;
      }
      fprintf((FILE *)this->out,"    QMetaObject::SuperData::link<%s::staticMetaObject>(),\n",
              puVar18);
      qVar10 = qVar10 + 0x18;
    }
    fwrite("    nullptr\n};\n\n",0x10,1,(FILE *)this->out);
  }
  pcVar24 = (this->cdef->super_BaseDef).qualified.d.ptr;
  if (pcVar24 == (char *)0x0) {
    pcVar24 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,"Q_CONSTINIT const QMetaObject %s::staticMetaObject = { {\n",pcVar24);
  if ((bVar5) || (pCVar12 = this->cdef, (pCVar12->superclassList).d.size == 0)) {
    fwrite("    nullptr,\n",0xd,1,(FILE *)this->out);
  }
  else {
    if ((pCVar12->hasQGadget == false) && (pCVar12->hasQNamespace == false)) {
      pFVar22 = (FILE *)this->out;
      pcVar24 = (this->purestSuperClass).d.ptr;
      if (pcVar24 == (char *)0x0) {
        pcVar24 = (char *)&QByteArray::_empty;
      }
      pcVar17 = "    QMetaObject::SuperData::link<%s::staticMetaObject>(),\n";
    }
    else {
      pFVar22 = (FILE *)this->out;
      pcVar24 = (this->purestSuperClass).d.ptr;
      if (pcVar24 == (char *)0x0) {
        pcVar24 = (char *)&QByteArray::_empty;
      }
      pcVar17 = "    QtPrivate::MetaObjectForType<%s>::value,\n";
    }
    fprintf(pFVar22,pcVar17,pcVar24);
  }
  pcVar24 = def.name.d.ptr;
  if (def.name.d.ptr == (char *)0x0) {
    pcVar24 = (char *)&QByteArray::_empty;
  }
  fprintf((FILE *)this->out,
          "    qt_staticMetaObjectStaticContent%s.stringdata,\n    qt_staticMetaObjectStaticContent%s.data,\n"
          ,pcVar24,pcVar24);
  if (bVar6 || bVar1 != false) {
    pcVar17 = "    nullptr,\n";
    sStack_1a0 = 0xd;
  }
  else {
    pcVar17 = "    qt_static_metacall,\n";
    sStack_1a0 = 0x18;
  }
  fwrite(pcVar17,sStack_1a0,1,(FILE *)this->out);
  if (local_58.m_haystack.m_data == (char *)0x0) {
    fwrite("    nullptr,\n",0xd,1,(FILE *)this->out);
  }
  else {
    pcVar17 = local_108.ptr;
    if (local_108.ptr == (char *)0x0) {
      pcVar17 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,"    qt_meta_extradata_%s,\n",pcVar17);
  }
  fprintf((FILE *)this->out,"    qt_staticMetaObjectRelocatingContent%s.metaTypes,\n",pcVar24);
  fwrite("    nullptr\n} };\n\n",0x12,1,(FILE *)this->out);
  if (!bVar6 && bVar1 == false) {
    generateStaticMetacall(this);
  }
  if (this->cdef->hasQObject == true) {
    pcVar24 = (this->cdef->super_BaseDef).qualified.d.ptr;
    if (pcVar24 == (char *)0x0) {
      pcVar24 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,
            "\nconst QMetaObject *%s::metaObject() const\n{\n    return QObject::d_ptr->metaObject ? QObject::d_ptr->dynamicMetaObject() : &staticMetaObject;\n}\n"
            ,pcVar24);
    pcVar24 = (this->cdef->super_BaseDef).qualified.d.ptr;
    if (pcVar24 == (char *)0x0) {
      pcVar24 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,"\nvoid *%s::qt_metacast(const char *_clname)\n{\n",pcVar24);
    fwrite("    if (!_clname) return nullptr;\n",0x22,1,(FILE *)this->out);
    pcVar24 = local_108.ptr;
    if (local_108.ptr == (char *)0x0) {
      pcVar24 = (char *)&QByteArray::_empty;
    }
    fprintf((FILE *)this->out,
            "    if (!strcmp(_clname, qt_staticMetaObjectStaticContent<qt_meta_tag_%s_t>.strings))\n        return static_cast<void*>(this);\n"
            ,pcVar24);
    pCVar12 = this->cdef;
    uVar27 = (pCVar12->superclassList).d.size;
    if (1 < uVar27) {
      pSVar3 = (pCVar12->superclassList).d.ptr;
      for (lVar33 = 0; uVar27 * 0x38 + -0x38 != lVar33; lVar33 = lVar33 + 0x38) {
        if (*(int *)((long)&pSVar3[1].access + lVar33) != 0) {
          puVar18 = *(undefined8 **)((long)&pSVar3[1].classname.d.ptr + lVar33);
          if (puVar18 == (undefined8 *)0x0) {
            puVar18 = &QByteArray::_empty;
          }
          fprintf((FILE *)this->out,
                  "    if (!strcmp(_clname, \"%s\"))\n        return static_cast< %s*>(this);\n",
                  puVar18);
        }
      }
      pCVar12 = this->cdef;
    }
    pQVar26 = (pCVar12->interfaceList).d.ptr;
    pQVar13 = pQVar26 + (pCVar12->interfaceList).d.size;
    for (; pQVar26 != pQVar13; pQVar26 = pQVar26 + 1) {
      lVar33 = 8;
      uVar27 = 0;
      while (uVar27 < (ulong)(pQVar26->d).size) {
        pcVar24 = (pQVar26->d).ptr[uVar27].interfaceId.d.ptr;
        if (pcVar24 == (char *)0x0) {
          pcVar24 = (char *)&QByteArray::_empty;
        }
        fprintf((FILE *)this->out,"    if (!strcmp(_clname, %s))\n        return ",pcVar24);
        lVar32 = lVar33;
        for (uVar30 = uVar27; pFVar22 = (FILE *)this->out, -1 < (long)uVar30; uVar30 = uVar30 - 1) {
          puVar18 = *(undefined8 **)((long)&(((pQVar26->d).ptr)->className).d.d + lVar32);
          if (puVar18 == (undefined8 *)0x0) {
            puVar18 = &QByteArray::_empty;
          }
          fprintf(pFVar22,"static_cast< %s*>(",puVar18);
          lVar32 = lVar32 + -0x30;
        }
        uVar27 = uVar27 + 1;
        QByteArray::QByteArray((QByteArray *)&local_e8,uVar27,')');
        pQVar19 = (QArrayDataPointer<char> *)local_e8.ptr;
        if ((QArrayDataPointer<char> *)local_e8.ptr == (QArrayDataPointer<char> *)0x0) {
          pQVar19 = (QArrayDataPointer<char> *)&QByteArray::_empty;
        }
        fprintf(pFVar22,"this%s;\n",pQVar19);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_e8);
        lVar33 = lVar33 + 0x30;
      }
    }
    pcVar24 = (char *)(this->purestSuperClass).d.size;
    if (bVar5 || pcVar24 == (char *)0x0) {
      fwrite("    return nullptr;\n",0x14,1,(FILE *)this->out);
    }
    else {
      local_e8.d = (this->purestSuperClass).d.d;
      local_e8.ptr = (this->purestSuperClass).d.ptr;
      if (local_e8.d != (Data *)0x0) {
        LOCK();
        ((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar19 = (QArrayDataPointer<char> *)local_e8.ptr;
      if ((QArrayDataPointer<char> *)local_e8.ptr == (QArrayDataPointer<char> *)0x0) {
        pQVar19 = (QArrayDataPointer<char> *)&QByteArray::_empty;
      }
      local_e8.size = (qsizetype)pcVar24;
      fprintf((FILE *)this->out,"    return %s::qt_metacast(_clname);\n",pQVar19);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_e8);
    }
    fwrite("}\n",2,1,(FILE *)this->out);
    if ((this->parser->super_Parser).activeQtMode == false) {
      generateMetacall(this);
      lVar33 = 0;
      for (lVar32 = 0; lVar32 < (int)(this->cdef->signalList).d.size; lVar32 = lVar32 + 1) {
        generateSignal(this,(FunctionDef *)
                            ((long)&(((this->cdef->signalList).d.ptr)->type).name.d.d + lVar33),
                       (int)lVar32);
        lVar33 = lVar33 + 0xd0;
      }
      generatePluginMetaData(this);
      if ((this->cdef->nonClassSignalList).d.size != 0) {
        pcVar24 = local_108.ptr;
        if (local_108.ptr == (char *)0x0) {
          pcVar24 = (char *)&QByteArray::_empty;
        }
        fprintf((FILE *)this->out,"namespace CheckNotifySignalValidity_%s {\n",pcVar24);
        pQVar31 = (this->cdef->nonClassSignalList).d.ptr;
        pQVar14 = pQVar31 + (this->cdef->nonClassSignalList).d.size;
        for (; pQVar31 != pQVar14; pQVar31 = pQVar31 + 1) {
          pPVar29 = (this->cdef->propertyList).d.ptr;
          lVar33 = (this->cdef->propertyList).d.size;
          lVar32 = 0;
          for (lVar28 = lVar33 >> 2; rhs = (QByteArray *)((long)&(pPVar29->notify).d.d + lVar32),
              0 < lVar28; lVar28 = lVar28 + -1) {
            bVar5 = operator==(pQVar31,rhs);
            if (bVar5) {
              pPVar21 = (PropertyDef *)((long)&(pPVar29->name).d.d + lVar32);
              goto LAB_00108a03;
            }
            bVar5 = operator==(pQVar31,(QByteArray *)((long)&pPVar29[1].notify.d.d + lVar32));
            if (bVar5) {
              pPVar21 = (PropertyDef *)((long)&pPVar29[1].name.d.d + lVar32);
              goto LAB_00108a03;
            }
            bVar5 = operator==(pQVar31,(QByteArray *)((long)&pPVar29[2].notify.d.d + lVar32));
            if (bVar5) {
              pPVar21 = (PropertyDef *)((long)&pPVar29[2].name.d.d + lVar32);
              goto LAB_00108a03;
            }
            bVar5 = operator==(pQVar31,(QByteArray *)((long)&pPVar29[3].notify.d.d + lVar32));
            if (bVar5) {
              pPVar21 = (PropertyDef *)((long)&pPVar29[3].name.d.d + lVar32);
              goto LAB_00108a03;
            }
            lVar32 = lVar32 + 0x560;
          }
          lVar28 = (lVar33 * 0x158 - lVar32) / 0x158;
          pPVar20 = (PropertyDef *)((long)&(pPVar29->name).d.d + lVar32);
          if (lVar28 == 1) {
LAB_001089ec:
            bVar5 = operator==(pQVar31,&pPVar20->notify);
            pPVar21 = pPVar20;
            if (!bVar5) {
              pPVar21 = pPVar29 + lVar33;
            }
          }
          else if (lVar28 == 3) {
            bVar5 = operator==(pQVar31,rhs);
            pPVar21 = pPVar20;
            if (!bVar5) {
              pPVar20 = (PropertyDef *)((long)&pPVar29[1].name.d.d + lVar32);
              goto LAB_001089d2;
            }
          }
          else {
            pPVar21 = pPVar29 + lVar33;
            if (lVar28 == 2) {
LAB_001089d2:
              bVar5 = operator==(pQVar31,&pPVar20->notify);
              pPVar21 = pPVar20;
              if (!bVar5) {
                pPVar20 = pPVar20 + 1;
                goto LAB_001089ec;
              }
            }
          }
LAB_00108a03:
          pcVar24 = (pQVar31->d).ptr;
          if (pcVar24 == (char *)0x0) {
            pcVar24 = (char *)&QByteArray::_empty;
          }
          fprintf((FILE *)this->out,
                  "template<typename T> using has_nullary_%s = decltype(std::declval<T>().%s());\n",
                  pcVar24);
          pcVar24 = (pQVar31->d).ptr;
          if (pcVar24 == (char *)0x0) {
            pcVar24 = (char *)&QByteArray::_empty;
          }
          pcVar17 = (pPVar21->type).d.ptr;
          if (pcVar17 == (char *)0x0) {
            pcVar17 = (char *)&QByteArray::_empty;
          }
          fprintf((FILE *)this->out,
                  "template<typename T> using has_unary_%s = decltype(std::declval<T>().%s(std::declval<%s>()));\n"
                  ,pcVar24,pcVar24,pcVar17);
          pcVar24 = (pQVar31->d).ptr;
          if (pcVar24 == (char *)0x0) {
            pcVar24 = (char *)&QByteArray::_empty;
          }
          pcVar17 = (this->cdef->super_BaseDef).qualified.d.ptr;
          if (pcVar17 == (char *)0x0) {
            pcVar17 = (char *)&QByteArray::_empty;
          }
          fprintf((FILE *)this->out,
                  "static_assert(qxp::is_detected_v<has_nullary_%s, %s> || qxp::is_detected_v<has_unary_%s, %s>,\n              \"NOTIFY signal %s does not exist in class (or is private in its parent)\");\n"
                  ,pcVar24,pcVar17,pcVar24,pcVar17,pcVar24);
        }
        fwrite("}\n",2,1,(FILE *)this->out);
      }
    }
  }
  QMultiHash<QByteArray,_QByteArray>::~QMultiHash(&local_118);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer((QArrayDataPointer<QByteArray> *)&local_58);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&def);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Generator::generateCode()
{
    bool isQObject = (cdef->classname == "QObject");
    bool isConstructible = !cdef->constructorList.isEmpty();

    // filter out undeclared enumerators and sets
    {
        QList<EnumDef> enumList;
        for (EnumDef def : std::as_const(cdef->enumList)) {
            if (cdef->enumDeclarations.contains(def.name)) {
                enumList += def;
            }
            def.enumName = def.name;
            QByteArray alias = cdef->flagAliases.value(def.name);
            if (cdef->enumDeclarations.contains(alias)) {
                def.name = alias;
                def.flags |= cdef->enumDeclarations[alias];
                enumList += def;
            }
        }
        cdef->enumList = enumList;
    }

//
// Register all strings used in data section
//
    strreg(cdef->qualified);
    registerClassInfoStrings();
    registerFunctionStrings(cdef->signalList);
    registerFunctionStrings(cdef->slotList);
    registerFunctionStrings(cdef->methodList);
    registerFunctionStrings(cdef->constructorList);
    registerByteArrayVector(cdef->nonClassSignalList);
    registerPropertyStrings();
    registerEnumStrings();

    const bool requireCompleteness = requireCompleteTypes || cdef->requireCompleteMethodTypes;
    bool hasStaticMetaCall =
            (cdef->hasQObject || !cdef->methodList.isEmpty()
             || !cdef->propertyList.isEmpty() || !cdef->constructorList.isEmpty());
    if (parser->activeQtMode)
        hasStaticMetaCall = false;

    const QByteArray qualifiedClassNameIdentifier = generateQualifiedClassNameIdentifier(cdef->qualified);

    // type name for the Q_OJBECT/GADGET itself, void for namespaces
    const char *ownType = !cdef->hasQNamespace ? cdef->classname.data() : "void";

    // ensure the qt_meta_tag_XXXX_t type is local
    fprintf(out, "namespace {\n"
                 "struct qt_meta_tag_%s_t {};\n"
                 "} // unnamed namespace\n\n",
            qualifiedClassNameIdentifier.constData());

//
// build the strings, data, and metatype arrays
//

    // We define a method inside the context of the class or namespace we're
    // creating the meta object for, so we get access to everything it has
    // access to and with the same contexts (for example, member enums and
    // types).
    fprintf(out, "template <> constexpr inline auto %s::qt_create_metaobjectdata<qt_meta_tag_%s_t>()\n"
                 "{\n"
                 "    namespace QMC = QtMocConstants;\n",
            cdef->qualified.constData(), qualifiedClassNameIdentifier.constData());

    fprintf(out, "    QtMocHelpers::StringRefStorage qt_stringData {");
    addStrings(strings);
    fprintf(out, "\n    };\n\n");

    fprintf(out, "    QtMocHelpers::UintData qt_methods {\n");

    // Build signals array first, otherwise the signal indices would be wrong
    addFunctions(cdef->signalList, "Signal");
    addFunctions(cdef->slotList, "Slot");
    addFunctions(cdef->methodList, "Method");
    fprintf(out, "    };\n"
                 "    QtMocHelpers::UintData qt_properties {\n");
    addProperties();
    fprintf(out, "    };\n"
                 "    QtMocHelpers::UintData qt_enums {\n");
    addEnums();
    fprintf(out, "    };\n");

    const char *uintDataParams = "";
    if (isConstructible || !cdef->classInfoList.isEmpty()) {
        if (isConstructible) {
            fprintf(out, "    using Constructor = QtMocHelpers::NoType;\n"
                         "    QtMocHelpers::UintData qt_constructors {\n");
            addFunctions(cdef->constructorList, "Constructor");
            fprintf(out, "    };\n");
        } else {
            fputs("    QtMocHelpers::UintData qt_constructors {};\n", out);
        }

        uintDataParams = ", qt_constructors";
        if (!cdef->classInfoList.isEmpty()) {
            fprintf(out, "    QtMocHelpers::ClassInfos qt_classinfo({\n");
            addClassInfos();
            fprintf(out, "    });\n");
            uintDataParams = ", qt_constructors, qt_classinfo";
        }
    }

    const char *metaObjectFlags = "QMC::MetaObjectFlag{}";
    if (cdef->hasQGadget || cdef->hasQNamespace) {
        // Ideally, all the classes could have that flag. But this broke
        // classes generated by qdbusxml2cpp which generate code that require
        // that we call qt_metacall for properties.
        metaObjectFlags = "QMC::PropertyAccessInStaticMetaCall";
    }
    {
        QByteArray tagType = QByteArrayLiteral("void");
        if (!requireCompleteness)
            tagType = "qt_meta_tag_" + qualifiedClassNameIdentifier +  "_t";
        fprintf(out, "    return QtMocHelpers::metaObjectData<%s, %s>(%s, qt_stringData,\n"
                     "            qt_methods, qt_properties, qt_enums%s);\n"
                     "}\n",
                ownType, tagType.constData(), metaObjectFlags, uintDataParams);
    }

    QByteArray metaVarNameSuffix;
    if (cdef->hasQNamespace) {
        // Q_NAMESPACE does not define the variables, so we have to. Declare as
        // plain, file-scope static variables (not templates).
        metaVarNameSuffix = '_' + qualifiedClassNameIdentifier;
        const char *n = metaVarNameSuffix.constData();
        fprintf(out, R"(
static constexpr auto qt_staticMetaObjectContent%s =
    %s::qt_create_metaobjectdata<qt_meta_tag%s_t>();
static constexpr auto qt_staticMetaObjectStaticContent%s =
    qt_staticMetaObjectContent%s.staticData;
static constexpr auto qt_staticMetaObjectRelocatingContent%s =
    qt_staticMetaObjectContent%s.relocatingData;

)",
                n, cdef->qualified.constData(), n,
                n, n,
                n, n);
    } else {
        // Q_OBJECT and Q_GADGET do declare them, so we just use the templates.
        metaVarNameSuffix = "<qt_meta_tag_" + qualifiedClassNameIdentifier + "_t>";
    }

//
// Build extra array
//
    QList<QByteArray> extraList;
    QMultiHash<QByteArray, QByteArray> knownExtraMetaObject(knownGadgets);
    knownExtraMetaObject.unite(knownQObjectClasses);

    for (const PropertyDef &p : std::as_const(cdef->propertyList)) {
        if (isBuiltinType(p.type))
            continue;

        if (p.type.contains('*') || p.type.contains('<') || p.type.contains('>'))
            continue;

        const qsizetype s = p.type.lastIndexOf("::");
        if (s <= 0)
            continue;

        QByteArray unqualifiedScope = p.type.left(s);

        // The scope may be a namespace for example, so it's only safe to include scopes that are known QObjects (QTBUG-2151)
        QMultiHash<QByteArray, QByteArray>::ConstIterator scopeIt;

        QByteArray thisScope = cdef->qualified;
        do {
            const qsizetype s = thisScope.lastIndexOf("::");
            thisScope = thisScope.left(s);
            QByteArray currentScope = thisScope.isEmpty() ? unqualifiedScope : thisScope + "::" + unqualifiedScope;
            scopeIt = knownExtraMetaObject.constFind(currentScope);
        } while (!thisScope.isEmpty() && scopeIt == knownExtraMetaObject.constEnd());

        if (scopeIt == knownExtraMetaObject.constEnd())
            continue;

        const QByteArray &scope = *scopeIt;

        if (scope == "Qt")
            continue;
        if (qualifiedNameEquals(cdef->qualified, scope))
            continue;

        if (!extraList.contains(scope))
            extraList += scope;
    }

    // QTBUG-20639 - Accept non-local enums for QML signal/slot parameters.
    // Look for any scoped enum declarations, and add those to the list
    // of extra/related metaobjects for this object.
    for (auto it = cdef->enumDeclarations.keyBegin(),
         end = cdef->enumDeclarations.keyEnd(); it != end; ++it) {
        const QByteArray &enumKey = *it;
        const qsizetype s = enumKey.lastIndexOf("::");
        if (s > 0) {
            QByteArray scope = enumKey.left(s);
            if (scope != "Qt" && !qualifiedNameEquals(cdef->qualified, scope) && !extraList.contains(scope))
                extraList += scope;
        }
    }

//
// Generate meta object link to parent meta objects
//

    if (!extraList.isEmpty()) {
        fprintf(out, "Q_CONSTINIT static const QMetaObject::SuperData qt_meta_extradata_%s[] = {\n",
                qualifiedClassNameIdentifier.constData());
        for (const QByteArray &ba : std::as_const(extraList))
            fprintf(out, "    QMetaObject::SuperData::link<%s::staticMetaObject>(),\n", ba.constData());

        fprintf(out, "    nullptr\n};\n\n");
    }

//
// Finally create and initialize the static meta object
//
    fprintf(out, "Q_CONSTINIT const QMetaObject %s::staticMetaObject = { {\n",
            cdef->qualified.constData());

    if (isQObject)
        fprintf(out, "    nullptr,\n");
    else if (cdef->superclassList.size() && !cdef->hasQGadget && !cdef->hasQNamespace) // for qobject, we know the super class must have a static metaobject
        fprintf(out, "    QMetaObject::SuperData::link<%s::staticMetaObject>(),\n", purestSuperClass.constData());
    else if (cdef->superclassList.size()) // for gadgets we need to query at compile time for it
        fprintf(out, "    QtPrivate::MetaObjectForType<%s>::value,\n", purestSuperClass.constData());
    else
        fprintf(out, "    nullptr,\n");
    fprintf(out, "    qt_staticMetaObjectStaticContent%s.stringdata,\n"
            "    qt_staticMetaObjectStaticContent%s.data,\n",
            metaVarNameSuffix.constData(),
            metaVarNameSuffix.constData());
    if (hasStaticMetaCall)
        fprintf(out, "    qt_static_metacall,\n");
    else
        fprintf(out, "    nullptr,\n");

    if (extraList.isEmpty())
        fprintf(out, "    nullptr,\n");
    else
        fprintf(out, "    qt_meta_extradata_%s,\n", qualifiedClassNameIdentifier.constData());

    fprintf(out, "    qt_staticMetaObjectRelocatingContent%s.metaTypes,\n",
            metaVarNameSuffix.constData());

    fprintf(out, "    nullptr\n} };\n\n");

//
// Generate internal qt_static_metacall() function
//
    if (hasStaticMetaCall)
        generateStaticMetacall();

    if (!cdef->hasQObject)
        return;

    fprintf(out, "\nconst QMetaObject *%s::metaObject() const\n{\n"
                 "    return QObject::d_ptr->metaObject ? QObject::d_ptr->dynamicMetaObject() : &staticMetaObject;\n"
                 "}\n",
            cdef->qualified.constData());

//
// Generate smart cast function
//
    fprintf(out, "\nvoid *%s::qt_metacast(const char *_clname)\n{\n", cdef->qualified.constData());
    fprintf(out, "    if (!_clname) return nullptr;\n");
    fprintf(out, "    if (!strcmp(_clname, qt_staticMetaObjectStaticContent<qt_meta_tag_%s_t>.strings))\n"
                  "        return static_cast<void*>(this);\n",
            qualifiedClassNameIdentifier.constData());

    // for all superclasses but the first one
    if (cdef->superclassList.size() > 1) {
        auto it = cdef->superclassList.cbegin() + 1;
        const auto end = cdef->superclassList.cend();
        for (; it != end; ++it) {
            if (it->access == FunctionDef::Private)
                continue;
            const char *cname = it->classname.constData();
            fprintf(out, "    if (!strcmp(_clname, \"%s\"))\n        return static_cast< %s*>(this);\n",
                    cname, cname);
        }
    }

    for (const QList<ClassDef::Interface> &iface : std::as_const(cdef->interfaceList)) {
        for (qsizetype j = 0; j < iface.size(); ++j) {
            fprintf(out, "    if (!strcmp(_clname, %s))\n        return ", iface.at(j).interfaceId.constData());
            for (qsizetype k = j; k >= 0; --k)
                fprintf(out, "static_cast< %s*>(", iface.at(k).className.constData());
            fprintf(out, "this%s;\n", QByteArray(j + 1, ')').constData());
        }
    }
    if (!purestSuperClass.isEmpty() && !isQObject) {
        QByteArray superClass = purestSuperClass;
        fprintf(out, "    return %s::qt_metacast(_clname);\n", superClass.constData());
    } else {
        fprintf(out, "    return nullptr;\n");
    }
    fprintf(out, "}\n");

    if (parser->activeQtMode)
        return;

//
// Generate internal qt_metacall()  function
//
    generateMetacall();

//
// Generate internal signal functions
//
    for (int signalindex = 0; signalindex < int(cdef->signalList.size()); ++signalindex)
        generateSignal(&cdef->signalList.at(signalindex), signalindex);

//
// Generate plugin meta data
//
    generatePluginMetaData();

//
// Generate function to make sure the non-class signals exist in the parent classes
//
    if (!cdef->nonClassSignalList.isEmpty()) {
        fprintf(out, "namespace CheckNotifySignalValidity_%s {\n", qualifiedClassNameIdentifier.constData());
        for (const QByteArray &nonClassSignal : std::as_const(cdef->nonClassSignalList)) {
            const auto propertyIt = std::find_if(cdef->propertyList.constBegin(),
                                   cdef->propertyList.constEnd(),
                                   [&nonClassSignal](const PropertyDef &p) {
                return nonClassSignal == p.notify;
            });
            // must find something, otherwise checkProperties wouldn't have inserted an entry into nonClassSignalList
            Q_ASSERT(propertyIt != cdef->propertyList.constEnd());
            fprintf(out, "template<typename T> using has_nullary_%s = decltype(std::declval<T>().%s());\n",
                    nonClassSignal.constData(),
                    nonClassSignal.constData());
            const auto &propertyType = propertyIt->type;
            fprintf(out, "template<typename T> using has_unary_%s = decltype(std::declval<T>().%s(std::declval<%s>()));\n",
                    nonClassSignal.constData(),
                    nonClassSignal.constData(),
                    propertyType.constData());
            fprintf(out, "static_assert(qxp::is_detected_v<has_nullary_%s, %s> || qxp::is_detected_v<has_unary_%s, %s>,\n"
                         "              \"NOTIFY signal %s does not exist in class (or is private in its parent)\");\n",
                    nonClassSignal.constData(), cdef->qualified.constData(),
                    nonClassSignal.constData(), cdef->qualified.constData(),
                    nonClassSignal.constData());
        }
        fprintf(out, "}\n");
    }
}